

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.c
# Opt level: O0

int pair1_pipe_init(void *arg,nni_pipe *pipe,void *pair)

{
  pair1_pipe *p;
  void *pair_local;
  nni_pipe *pipe_local;
  void *arg_local;
  
  nni_aio_init((nni_aio *)((long)arg + 0x10),pair1_pipe_send_cb,arg);
  nni_aio_init((nni_aio *)((long)arg + 0x1d8),pair1_pipe_recv_cb,arg);
  *(nni_pipe **)arg = pipe;
  *(void **)((long)arg + 8) = pair;
  return 0;
}

Assistant:

static int
pair1_pipe_init(void *arg, nni_pipe *pipe, void *pair)
{
	pair1_pipe *p = arg;

	nni_aio_init(&p->aio_send, pair1_pipe_send_cb, p);
	nni_aio_init(&p->aio_recv, pair1_pipe_recv_cb, p);

	p->pipe = pipe;
	p->pair = pair;

	return (0);
}